

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::CheckLabelFilterInclude(cmCTestTestHandler *this,cmCTestTestProperties *it)

{
  pointer expressions;
  bool bVar1;
  
  expressions = (this->IncludeLabelRegularExpressions).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (expressions !=
      (this->IncludeLabelRegularExpressions).
      super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if (((it->Labels).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (it->Labels).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar1 = MatchLabelsAgainstFilterRE
                          (&it->Labels,
                           (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                            *)expressions), bVar1)) {
      return;
    }
    it->IsInBasedOnREOptions = false;
  }
  return;
}

Assistant:

void cmCTestTestHandler::CheckLabelFilterInclude(cmCTestTestProperties& it)
{
  // if not using Labels to filter then return
  if (this->IncludeLabelRegularExpressions.empty()) {
    return;
  }
  // if there are no labels and we are filtering by labels
  // then exclude the test as it does not have the label
  if (it.Labels.empty()) {
    it.IsInBasedOnREOptions = false;
    return;
  }
  // if no match was found, exclude the test
  if (!MatchLabelsAgainstFilterRE(it.Labels,
                                  this->IncludeLabelRegularExpressions)) {
    it.IsInBasedOnREOptions = false;
  }
}